

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::FileDescriptorProto::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  FileDescriptorProto *pFVar2;
  string *psVar3;
  FileDescriptorProto **v1;
  FileDescriptorProto **v2;
  char *failure_msg;
  LogMessage *pLVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar5;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar6;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this;
  RepeatedPtrField<google::protobuf::DescriptorProto> *other;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *other_00;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto> *other_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *other_02;
  RepeatedField<int> *pRVar7;
  RepeatedField<int> *pRVar8;
  uint32_t *puVar9;
  Arena *pAVar10;
  FileOptions *pFVar11;
  SourceCodeInfo *pSVar12;
  LogMessage local_100;
  Voidify local_ea;
  byte local_e9;
  LogMessage local_e8;
  Voidify local_d1;
  uint local_d0;
  uint32_t cached_has_bits;
  LogMessage local_c0;
  Voidify local_a9;
  FileDescriptorProto *local_a8;
  Nullable<const_char_*> local_a0;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Arena *arena;
  FileDescriptorProto *from;
  FileDescriptorProto *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  Nullable<const_char_*> local_68;
  char *local_60;
  Nullable<const_char_*> local_58;
  string *local_50;
  FileDescriptorProto *local_48;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_40;
  string *local_38;
  FileDescriptorProto *local_30;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_28;
  string *local_20;
  FileDescriptorProto *local_18;
  anon_union_232_1_493b367e_for_FileDescriptorProto_3 *local_10;
  
  arena = (Arena *)from_msg;
  from = (FileDescriptorProto *)to_msg;
  _this = (FileDescriptorProto *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)MessageLite::GetArena(to_msg);
  local_a8 = (FileDescriptorProto *)arena;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FileDescriptorProto_const*>(&local_a8);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::FileDescriptorProto*>(&from);
  local_a0 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::FileDescriptorProto_const*,google::protobuf::FileDescriptorProto*>
                       (v1,v2,"&from != _this");
  if (local_a0 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_a0);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0xc4f,failure_msg);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_c0);
  }
  local_d0 = 0;
  pRVar5 = _internal_mutable_dependency_abi_cxx11_(from);
  pRVar6 = _internal_dependency_abi_cxx11_((FileDescriptorProto *)arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar5,pRVar6);
  this = _internal_mutable_message_type(from);
  other = _internal_message_type((FileDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::DescriptorProto>::MergeFrom(this,other);
  this_00 = _internal_mutable_enum_type(from);
  other_00 = _internal_enum_type((FileDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::EnumDescriptorProto>::MergeFrom(this_00,other_00);
  this_01 = _internal_mutable_service(from);
  other_01 = _internal_service((FileDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::ServiceDescriptorProto>::MergeFrom(this_01,other_01);
  this_02 = _internal_mutable_extension(from);
  other_02 = _internal_extension((FileDescriptorProto *)arena);
  RepeatedPtrField<google::protobuf::FieldDescriptorProto>::MergeFrom(this_02,other_02);
  pRVar7 = _internal_mutable_public_dependency(from);
  pRVar8 = _internal_public_dependency((FileDescriptorProto *)arena);
  RepeatedField<int>::MergeFrom(pRVar7,pRVar8);
  pRVar7 = _internal_mutable_weak_dependency(from);
  pRVar8 = _internal_weak_dependency((FileDescriptorProto *)arena);
  RepeatedField<int>::MergeFrom(pRVar7,pRVar8);
  pRVar5 = _internal_mutable_option_dependency_abi_cxx11_(from);
  pRVar6 = _internal_option_dependency_abi_cxx11_((FileDescriptorProto *)arena);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MergeFrom(pRVar5,pRVar6);
  puVar9 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  pFVar2 = from;
  local_d0 = *puVar9;
  if ((local_d0 & 0x3f) != 0) {
    if ((local_d0 & 1) != 0) {
      local_50 = _internal_name_abi_cxx11_((FileDescriptorProto *)arena);
      local_48 = pFVar2;
      local_40 = &pFVar2->field_0;
      puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_50;
      *puVar9 = *puVar9 | 1;
      pAVar10 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.name_,psVar3,pAVar10);
    }
    pFVar2 = from;
    if ((local_d0 & 2) != 0) {
      local_38 = _internal_package_abi_cxx11_((FileDescriptorProto *)arena);
      local_30 = pFVar2;
      local_28 = &pFVar2->field_0;
      puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_38;
      *puVar9 = *puVar9 | 2;
      pAVar10 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.package_,psVar3,pAVar10);
    }
    pFVar2 = from;
    if ((local_d0 & 4) != 0) {
      local_20 = _internal_syntax_abi_cxx11_((FileDescriptorProto *)arena);
      local_18 = pFVar2;
      local_10 = &pFVar2->field_0;
      puVar9 = internal::HasBits<1>::operator[](&(pFVar2->field_0)._impl_._has_bits_,0);
      psVar3 = local_20;
      *puVar9 = *puVar9 | 4;
      pAVar10 = MessageLite::GetArena((MessageLite *)pFVar2);
      internal::ArenaStringPtr::Set<>(&(pFVar2->field_0)._impl_.syntax_,psVar3,pAVar10);
    }
    if ((local_d0 & 8) != 0) {
      local_e9 = 0;
      if (arena[1].impl_.first_arena_.limit_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0xc6b,"from._impl_.options_ != nullptr");
        local_e9 = 1;
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_e8);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_d1,pLVar4);
      }
      if ((local_e9 & 1) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_e8);
      }
      if ((from->field_0)._impl_.options_ == (FileOptions *)0x0) {
        to_msg_local = (MessageLite *)arena[1].impl_.first_arena_.limit_;
        local_68 = absl_log_internal_check_op_result;
        pFVar11 = (FileOptions *)
                  Arena::CopyConstruct<google::protobuf::FileOptions>
                            ((Arena *)absl_log_internal_check_op_result,to_msg_local);
        (from->field_0)._impl_.options_ = pFVar11;
      }
      else {
        FileOptions::MergeFrom
                  ((from->field_0)._impl_.options_,(FileOptions *)arena[1].impl_.first_arena_.limit_
                  );
      }
    }
    if ((local_d0 & 0x10) != 0) {
      if (arena[1].impl_.first_arena_.prefetch_ptr_ == (char *)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_100,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
                   ,0xc73,"from._impl_.source_code_info_ != nullptr");
        pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_100);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_ea,pLVar4);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_100);
      }
      if ((from->field_0)._impl_.source_code_info_ == (SourceCodeInfo *)0x0) {
        local_60 = arena[1].impl_.first_arena_.prefetch_ptr_;
        local_58 = absl_log_internal_check_op_result;
        pSVar12 = (SourceCodeInfo *)
                  Arena::CopyConstruct<google::protobuf::SourceCodeInfo>
                            ((Arena *)absl_log_internal_check_op_result,local_60);
        (from->field_0)._impl_.source_code_info_ = pSVar12;
      }
      else {
        SourceCodeInfo::MergeFrom
                  ((from->field_0)._impl_.source_code_info_,
                   (SourceCodeInfo *)arena[1].impl_.first_arena_.prefetch_ptr_);
      }
    }
    if ((local_d0 & 0x20) != 0) {
      (from->field_0)._impl_.edition_ = *(int *)&arena[1].impl_.first_arena_.cleanup_list_.head_;
    }
  }
  uVar1 = local_d0;
  puVar9 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar9 = uVar1 | *puVar9;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void FileDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileDescriptorProto*>(&to_msg);
  auto& from = static_cast<const FileDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_dependency()->MergeFrom(from._internal_dependency());
  _this->_internal_mutable_message_type()->MergeFrom(
      from._internal_message_type());
  _this->_internal_mutable_enum_type()->MergeFrom(
      from._internal_enum_type());
  _this->_internal_mutable_service()->MergeFrom(
      from._internal_service());
  _this->_internal_mutable_extension()->MergeFrom(
      from._internal_extension());
  _this->_internal_mutable_public_dependency()->MergeFrom(from._internal_public_dependency());
  _this->_internal_mutable_weak_dependency()->MergeFrom(from._internal_weak_dependency());
  _this->_internal_mutable_option_dependency()->MergeFrom(from._internal_option_dependency());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_package(from._internal_package());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_syntax(from._internal_syntax());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      ABSL_DCHECK(from._impl_.source_code_info_ != nullptr);
      if (_this->_impl_.source_code_info_ == nullptr) {
        _this->_impl_.source_code_info_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.source_code_info_);
      } else {
        _this->_impl_.source_code_info_->MergeFrom(*from._impl_.source_code_info_);
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_impl_.edition_ = from._impl_.edition_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}